

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

int __thiscall QFSFileEngine::mkdir(QFSFileEngine *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  undefined7 extraout_var;
  optional<QFlags<QFileDevice::Permission>_> in_RCX;
  long in_FS_OFFSET;
  QFileSystemEntry QStack_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::QFileSystemEntry(&QStack_58,(QString *)__path);
  bVar1 = QFileSystemEngine::createDirectory(&QStack_58,SUB41(__mode,0),in_RCX);
  QFileSystemEntry::~QFileSystemEntry(&QStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::mkdir(const QString &name, bool createParentDirectories,
                          std::optional<QFile::Permissions> permissions) const
{
    return QFileSystemEngine::createDirectory(QFileSystemEntry(name), createParentDirectories,
                                              permissions);
}